

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Database::FindIf(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *__return_storage_ptr__,Database *this,Predicate *pred)

{
  _Base_ptr p_Var1;
  bool bVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr __args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream fmt;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var4 = (this->storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->storage)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var1 = p_Var4[1]._M_right;
    for (__args_1 = p_Var4[1]._M_left; __args_1 != p_Var1; __args_1 = __args_1 + 1) {
      bVar2 = std::
              function<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(pred,(Date *)(p_Var4 + 1),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __args_1);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fmt);
        poVar3 = operator<<((ostream *)&fmt,(Date *)(p_Var4 + 1));
        poVar3 = std::operator<<(poVar3,' ');
        std::operator<<(poVar3,(string *)__args_1);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fmt);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> Database::FindIf(Predicate pred) const {
    vector<string> result;

    for (const auto& kv : storage) {
        const auto& date = kv.first;
        const auto& ev_queue = kv.second;

        for_each(ev_queue.begin(), ev_queue.end(), [&pred, &result, &date](const string& event) {
            if (pred(date, event)) {
                ostringstream fmt;
                fmt << date << ' ' << event;

                result.push_back(fmt.str());
            }
        });
    }

    return result;
}